

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_DimensionPrinter>::
ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_DimensionPrinter>
                *this)

{
  BinaryReader<mp::internal::EndiannessConverter> *pBVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_18;
  
  pBVar1 = this->reader_;
  pbVar2 = (byte *)(pBVar1->super_BinaryReaderBase).super_ReaderBase.ptr_;
  (pBVar1->super_BinaryReaderBase).super_ReaderBase.token_ = (char *)pbVar2;
  (pBVar1->super_BinaryReaderBase).super_ReaderBase.ptr_ = (char *)(pbVar2 + 1);
  bVar3 = true;
  iVar4 = *pbVar2 - 0x6c;
  switch(iVar4) {
  case 0:
  case 2:
  case 7:
    ReadConstant(this,*pbVar2);
    iVar4 = 0;
    break;
  default:
    goto switchD_00112a34_caseD_1;
  case 3:
    iVar4 = ReadOpCode(this);
    iVar4 = ReadLogicalExpr(this,iVar4);
  }
  bVar3 = false;
switchD_00112a34_caseD_1:
  if (bVar3) {
    local_28 = 0;
    uStack_20 = 0;
    local_18.types_ = 0;
    local_18.field_1.values_ = (Value *)&local_28;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x139fb5,&local_18);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}